

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_dump.cpp
# Opt level: O1

void __thiscall hex_dump::dump(hex_dump *this,interface *config,uint8_t *begin,size_t size)

{
  ostream *poVar1;
  byte *pbVar2;
  byte *pbVar3;
  long lVar4;
  byte bVar5;
  bool bVar6;
  char local_45;
  char local_44;
  char local_43;
  byte local_42;
  char local_41;
  byte *local_40;
  interface *local_38;
  
  local_38 = config;
  line_header(this,config);
  if (size != 0) {
    lVar4 = 0x10;
    pbVar2 = begin;
    do {
      bVar5 = *pbVar2;
      local_45 = (bVar5 >> 4) + 0x57;
      if (bVar5 < 0xa0) {
        local_45 = (bVar5 >> 4) + 0x30;
      }
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>(this->output_,&local_45,1);
      bVar5 = bVar5 & 0xf;
      local_44 = bVar5 + 0x57;
      if (bVar5 < 10) {
        local_44 = bVar5 + 0x30;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_44,1);
      local_43 = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(this->output_,&local_43,1);
      lVar4 = lVar4 + -1;
      size = size - 1;
      pbVar3 = pbVar2 + 1;
      if (size == 0 || lVar4 == 0) {
        for (; local_40 = pbVar3, lVar4 != 0; lVar4 = lVar4 + -1) {
          std::__ostream_insert<char,std::char_traits<char>>(this->output_,"   ",3);
          pbVar3 = local_40;
        }
        pbVar3 = begin;
        if (begin != local_40) {
          do {
            local_42 = *pbVar3;
            if (0x5e < (byte)(*pbVar3 - 0x20)) {
              local_42 = 0x2e;
            }
            std::__ostream_insert<char,std::char_traits<char>>(this->output_,(char *)&local_42,1);
            begin = pbVar3 + 1;
            bVar6 = pbVar3 != pbVar2;
            pbVar3 = begin;
          } while (bVar6);
        }
        local_41 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(this->output_,&local_41,1);
        lVar4 = 0x10;
        pbVar3 = local_40;
        if (size != 0) {
          line_header(this,local_38);
          pbVar3 = local_40;
        }
      }
      pbVar2 = pbVar3;
    } while (size != 0);
  }
  return;
}

Assistant:

void hex_dump::dump( const interface& config, const std::uint8_t* begin, std::size_t size )
{
    static const std::size_t page_width = 16;
    std::size_t              char_cnt   = page_width;
    const std::uint8_t*      line_start = begin;

    line_header( config );

    while ( size )
    {
        print_hex( output_, *begin );
        output_ << ' ';

        --size;
        ++begin;
        --char_cnt;

        if ( char_cnt == 0 || size == 0 )
        {
            // fill rest of the line
            for ( ; char_cnt != 0; --char_cnt)
                output_ << "   ";

            for ( ; line_start != begin; ++line_start )
                output_ << as_printable( *line_start );

            output_ << '\n';

            if ( size )
                line_header( config );

            char_cnt   = page_width;
        }
    }
}